

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

bool __thiscall libcellml::Annotator::assignAllIds(Annotator *this)

{
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  AnnotatorImpl *pAVar4;
  size_t initialSize;
  shared_ptr<libcellml::Model> model;
  Annotator *this_local;
  
  model.super___shared_ptr<libcellml::Model,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this;
  pFunc(this);
  std::weak_ptr<libcellml::Model>::lock((weak_ptr<libcellml::Model> *)&initialSize);
  bVar1 = std::operator!=((shared_ptr<libcellml::Model> *)&initialSize,(nullptr_t)0x0);
  if (bVar1) {
    pAVar4 = pFunc(this);
    sVar2 = AnnotatorImpl::idCount(pAVar4);
    pAVar4 = pFunc(this);
    AnnotatorImpl::doSetAllAutomaticIds(pAVar4);
    pAVar4 = pFunc(this);
    sVar3 = AnnotatorImpl::idCount(pAVar4);
    this_local._7_1_ = sVar2 < sVar3;
  }
  else {
    pAVar4 = pFunc(this);
    AnnotatorImpl::addIssueNoModel(pAVar4);
    this_local._7_1_ = false;
  }
  std::shared_ptr<libcellml::Model>::~shared_ptr((shared_ptr<libcellml::Model> *)&initialSize);
  return this_local._7_1_;
}

Assistant:

bool Annotator::assignAllIds()
{
    auto model = pFunc()->mModel.lock();
    if (model != nullptr) {
        size_t initialSize = pFunc()->idCount();
        pFunc()->doSetAllAutomaticIds();
        return pFunc()->idCount() > initialSize;
    }
    pFunc()->addIssueNoModel();
    return false;
}